

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::CloudMediumProvider::Density(CloudMediumProvider *this,Point3f *p,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  undefined8 uVar15;
  undefined1 auVar16 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  Point3<float> PVar17;
  int i_1;
  Float lac;
  Float scale;
  Float d;
  Point3f pd;
  Float base;
  Float delta;
  int i;
  Float vlac;
  Float vscale;
  Point3f pp;
  float in_stack_fffffffffffffd78;
  float in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int low;
  undefined4 in_stack_fffffffffffffd88;
  int high;
  float in_stack_fffffffffffffd8c;
  float fVar18;
  Tuple3<pbrt::Point3,_float> *this_00;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffffd98;
  undefined8 *in_stack_fffffffffffffda0;
  float local_210;
  float local_20c;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f4;
  float local_1ec;
  int local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  Tuple3<pbrt::Point3,_float> local_1d8;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_198;
  float local_190;
  undefined8 local_188;
  float local_180;
  Tuple3<pbrt::Point3,_float> local_17c;
  undefined8 local_170;
  float local_168;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  Tuple3<pbrt::Point3,_float> local_10c;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  Tuple3<pbrt::Point3,_float> local_bc;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  Float local_5c;
  undefined4 local_58;
  int local_54;
  float local_50;
  float local_4c;
  undefined8 local_48;
  float local_40;
  undefined8 local_34;
  float local_2c;
  long local_20;
  array<float,_4> local_10;
  undefined1 extraout_var [60];
  
  auVar16 = (undefined1  [56])0x0;
  local_20 = in_RSI;
  PVar17 = pbrt::operator*((float)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                           in_stack_fffffffffffffd98);
  local_40 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar16;
  local_48 = vmovlpd_avx(auVar3._0_16_);
  local_34 = local_48;
  local_2c = local_40;
  if (0.0 < *(float *)(in_RDI + 0x1c)) {
    local_4c = *(float *)(in_RDI + 0x1c) * 0.05;
    local_50 = 10.0;
    for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
      local_58 = 0x3c23d70a;
      auVar16 = (undefined1  [56])0x0;
      in_stack_fffffffffffffda0 = &local_34;
      PVar17 = pbrt::operator*((float)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                               in_stack_fffffffffffffd98);
      local_70 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      auVar4._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar4._8_56_ = auVar16;
      local_78 = vmovlpd_avx(auVar4._0_16_);
      local_68 = local_78;
      local_60 = local_70;
      local_5c = Noise((Point3f *)0x8045fa);
      auVar16 = (undefined1  [56])0x0;
      PVar17 = pbrt::operator*((float)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                               in_stack_fffffffffffffd98);
      local_a8 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      auVar5._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar5._8_56_ = auVar16;
      local_b0 = vmovlpd_avx(auVar5._0_16_);
      auVar16 = (undefined1  [56])0x0;
      this_00 = &local_bc;
      local_a0 = local_b0;
      local_98 = local_a8;
      Vector3<float>::Vector3
                ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,0.0);
      PVar17 = Point3<float>::operator+
                         ((Point3<float> *)this_00,
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      local_c8 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      auVar6._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar6._8_56_ = auVar16;
      local_d0 = vmovlpd_avx(auVar6._0_16_);
      local_90 = local_d0;
      local_88 = local_c8;
      Noise((Point3f *)0x8046be);
      auVar16 = (undefined1  [56])0x0;
      PVar17 = pbrt::operator*((float)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                               in_stack_fffffffffffffd98);
      local_f8 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      auVar7._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar7._8_56_ = auVar16;
      local_100 = vmovlpd_avx(auVar7._0_16_);
      in_stack_fffffffffffffd98 = &local_10c;
      auVar16 = ZEXT856(0);
      local_f0 = local_100;
      local_e8 = local_f8;
      Vector3<float>::Vector3
                ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,0.0);
      PVar17 = Point3<float>::operator+
                         ((Point3<float> *)this_00,
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      local_118 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      auVar8._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar8._8_56_ = auVar16;
      local_120 = vmovlpd_avx(auVar8._0_16_);
      local_e0 = local_120;
      local_d8 = local_118;
      Noise((Point3f *)0x80477b);
      auVar16 = (undefined1  [56])0x0;
      PVar17 = pbrt::operator*((float)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                               in_stack_fffffffffffffd98);
      local_148 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      auVar9._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar9._8_56_ = auVar16;
      local_150 = vmovlpd_avx(auVar9._0_16_);
      auVar16 = ZEXT856(0);
      local_140 = local_150;
      local_138 = local_148;
      Vector3<float>::Vector3
                ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,0.0);
      PVar17 = Point3<float>::operator+
                         ((Point3<float> *)this_00,
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      local_168 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      auVar10._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar10._8_56_ = auVar16;
      local_170 = vmovlpd_avx(auVar10._0_16_);
      local_130 = local_170;
      local_128 = local_168;
      Noise((Point3f *)0x80483c);
      Point3<float>::Point3
                ((Point3<float> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,0.0);
      uVar15 = 0;
      Vector3<float>::Vector3
                ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,0.0);
      PVar17 = Point3<float>::operator-
                         ((Point3<float> *)this_00,
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      local_1b0 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      auVar16 = (undefined1  [56])0x0;
      auVar1._8_8_ = uVar15;
      auVar1._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      local_1b8 = vmovlpd_avx(auVar1);
      local_198 = local_1b8;
      local_190 = local_1b0;
      PVar17 = pbrt::operator*((float)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                               in_stack_fffffffffffffd98);
      local_1c0 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      auVar11._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar11._8_56_ = auVar16;
      local_1c8 = vmovlpd_avx(auVar11._0_16_);
      auVar16 = (undefined1  [56])0x0;
      local_188 = local_1c8;
      local_180 = local_1c0;
      PVar17 = Tuple3<pbrt::Point3,float>::operator/(this_00,in_stack_fffffffffffffd8c);
      local_1d8.z = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      auVar12._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar12._8_56_ = auVar16;
      local_1d8._0_8_ = vmovlpd_avx(auVar12._0_16_);
      local_17c._0_8_ = local_1d8._0_8_;
      local_17c.z = local_1d8.z;
      Tuple3<pbrt::Point3,float>::operator+=
                ((Tuple3<pbrt::Point3,float> *)&local_34,(Point3<float> *)&local_17c);
      local_4c = local_4c * 0.5;
      local_50 = local_50 * 2.01;
    }
  }
  local_1dc = 0.0;
  local_1e0 = 0.5;
  local_1e4 = 1.0;
  for (local_1e8 = 0; local_1e8 < 5; local_1e8 = local_1e8 + 1) {
    auVar16 = (undefined1  [56])0x0;
    fVar18 = local_1e0;
    PVar17 = pbrt::operator*((float)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                             in_stack_fffffffffffffd98);
    local_200 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
    auVar13._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar13._8_56_ = auVar16;
    local_208 = vmovlpd_avx(auVar13._0_16_);
    local_1f4 = local_208;
    local_1ec = local_200;
    auVar14._0_4_ = Noise((Point3f *)0x804a77);
    auVar14._4_60_ = extraout_var;
    auVar1 = vfmadd213ss_fma(auVar14._0_16_,ZEXT416((uint)fVar18),ZEXT416((uint)local_1dc));
    local_1dc = auVar1._0_4_;
    local_1e0 = local_1e0 * 0.5;
    local_1e4 = local_1e4 * 2.01;
  }
  low = 0;
  high = 1;
  local_1dc = Clamp<float,int,int>
                        ((1.0 - *(float *)(local_20 + 4)) * 4.5 * *(float *)(in_RDI + 0x18) *
                         local_1dc,0,1);
  local_20c = 0.0;
  local_210 = 0.5 - *(float *)(local_20 + 4);
  pfVar2 = std::max<float>(&local_20c,&local_210);
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)*pfVar2),
                           ZEXT416((uint)local_1dc));
  local_1dc = auVar1._0_4_;
  Clamp<float,int,int>(local_1dc,low,high);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(low,in_stack_fffffffffffffd80),in_stack_fffffffffffffd7c);
  return (array<float,_4>)(array<float,_4>)local_10.values;
}

Assistant:

Density(const Point3f &p, const SampledWavelengths &lambda) const {
        Point3f pp = 5 * extent * p;

        // Use noise to perturb the lookup point.
        if (wispiness > 0) {
            Float vscale = .05f * wispiness, vlac = 10.f;
            for (int i = 0; i < 2; ++i) {
                Float delta = .01f;
                // TODO: update Noise() to return the gradient?
                Float base = Noise(vlac * pp);
                Point3f pd(Noise(vlac * pp + Vector3f(delta, 0, 0)),
                           Noise(vlac * pp + Vector3f(0, delta, 0)),
                           Noise(vlac * pp + Vector3f(0, 0, delta)));
                pp += vscale * (pd - Vector3f(base, base, base)) / delta;
                vscale *= 0.5f;
                vlac *= 2.01f;
            }
        }

        Float d = 0;
        Float scale = .5, lac = 1.f;
        for (int i = 0; i < 5; ++i) {
            d += scale * Noise(lac * pp);
            scale *= 0.5f;
            lac *= 2.01f;
        }

        d = Clamp((1 - p.y) * 4.5f * density * d, 0, 1);
        d += 2 * std::max<Float>(0, .5f - p.y);
        return SampledSpectrum(Clamp(d, 0, 1));
    }